

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::DefaultVAOCase::iterate(DefaultVAOCase *this)

{
  deUint32 *this_00;
  int iVar1;
  deUint32 buffer_00;
  GLenum value;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *this_01;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  Enum<int,_2UL> EVar5;
  Enum<int,_2UL> local_1e8;
  MessageBuilder local_1d8;
  undefined1 local_48 [8];
  Buffer buffer;
  CallLogWrapper gl;
  GLenum error;
  DefaultVAOCase *this_local;
  
  pRVar2 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  this_01 = Context::getTestContext((this->super_TestCase).m_context);
  pTVar3 = tcu::TestContext::getLog(this_01);
  this_00 = &buffer.super_ObjectWrapper.m_object;
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)this_00,(Functions *)CONCAT44(extraout_var,iVar1),pTVar3);
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)this_00,true);
  switch(this->m_caseType) {
  case CASE_BIND_VERTEX_BUFFER:
    pRVar2 = Context::getRenderContext((this->super_TestCase).m_context);
    glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
              ((TypedObjectWrapper<(glu::ObjectType)1> *)local_48,pRVar2);
    buffer_00 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_48);
    glu::CallLogWrapper::glBindVertexBuffer
              ((CallLogWrapper *)&buffer.super_ObjectWrapper.m_object,0,buffer_00,0,0);
    glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
              ((TypedObjectWrapper<(glu::ObjectType)1> *)local_48);
    break;
  case CASE_VERTEX_ATTRIB_FORMAT:
    glu::CallLogWrapper::glVertexAttribFormat
              ((CallLogWrapper *)&buffer.super_ObjectWrapper.m_object,0,4,0x1406,'\0',0);
    break;
  case CASE_VERTEX_ATTRIB_I_FORMAT:
    glu::CallLogWrapper::glVertexAttribIFormat
              ((CallLogWrapper *)&buffer.super_ObjectWrapper.m_object,0,4,0x1404,0);
    break;
  case CASE_VERTEX_ATTRIB_BINDING:
    glu::CallLogWrapper::glVertexAttribBinding
              ((CallLogWrapper *)&buffer.super_ObjectWrapper.m_object,0,0);
    break;
  case CASE_VERTEX_BINDING_DIVISOR:
    glu::CallLogWrapper::glVertexBindingDivisor
              ((CallLogWrapper *)&buffer.super_ObjectWrapper.m_object,0,1);
  }
  value = glu::CallLogWrapper::glGetError((CallLogWrapper *)&buffer.super_ObjectWrapper.m_object);
  if (value == 0x502) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  else {
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1d8,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_1d8,(char (*) [43])"ERROR! Expected GL_INVALID_OPERATION, got ");
    EVar5 = glu::getErrorStr(value);
    local_1e8.m_getName = EVar5.m_getName;
    local_1e8.m_value = EVar5.m_value;
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_1e8);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1d8);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Invalid error");
  }
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)&buffer.super_ObjectWrapper.m_object);
  return STOP;
}

Assistant:

DefaultVAOCase::IterateResult DefaultVAOCase::iterate (void)
{
	glw::GLenum			error	= 0;
	glu::CallLogWrapper gl		(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());

	gl.enableLogging(true);

	switch (m_caseType)
	{
		case CASE_BIND_VERTEX_BUFFER:
		{
			glu::Buffer buffer(m_context.getRenderContext());
			gl.glBindVertexBuffer(0, *buffer, 0, 0);
			break;
		}

		case CASE_VERTEX_ATTRIB_FORMAT:
			gl.glVertexAttribFormat(0, 4, GL_FLOAT, GL_FALSE, 0);
			break;

		case CASE_VERTEX_ATTRIB_I_FORMAT:
			gl.glVertexAttribIFormat(0, 4, GL_INT, 0);
			break;

		case CASE_VERTEX_ATTRIB_BINDING:
			gl.glVertexAttribBinding(0, 0);
			break;

		case CASE_VERTEX_BINDING_DIVISOR:
			gl.glVertexBindingDivisor(0, 1);
			break;

		default:
			DE_ASSERT(false);
	}

	error = gl.glGetError();

	if (error != GL_INVALID_OPERATION)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "ERROR! Expected GL_INVALID_OPERATION, got " << glu::getErrorStr(error) << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid error");
	}
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}